

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDCpp14.h
# Opt level: O0

_Unknown_bound __thiscall mmd::make_unique<pmx::PmxMorphGroupOffset[]>(mmd *this,size_t n)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  PmxMorphGroupOffset *__p;
  PmxMorphGroupOffset *local_58;
  size_t n_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = n;
  uVar2 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  __p = (PmxMorphGroupOffset *)operator_new__(uVar2);
  if (n != 0) {
    local_58 = __p;
    do {
      pmx::PmxMorphGroupOffset::PmxMorphGroupOffset(local_58);
      local_58 = local_58 + 1;
    } while (local_58 != __p + n);
  }
  std::unique_ptr<pmx::PmxMorphGroupOffset[],std::default_delete<pmx::PmxMorphGroupOffset[]>>::
  unique_ptr<pmx::PmxMorphGroupOffset*,std::default_delete<pmx::PmxMorphGroupOffset[]>,void,bool>
            ((unique_ptr<pmx::PmxMorphGroupOffset[],std::default_delete<pmx::PmxMorphGroupOffset[]>>
              *)this,__p);
  return (__uniq_ptr_data<pmx::PmxMorphGroupOffset,_std::default_delete<pmx::PmxMorphGroupOffset[]>,_true,_true>
          )(__uniq_ptr_data<pmx::PmxMorphGroupOffset,_std::default_delete<pmx::PmxMorphGroupOffset[]>,_true,_true>
            )this;
}

Assistant:

typename _Unique_if<T>::_Unknown_bound
        make_unique(size_t n) {
            typedef typename std::remove_extent<T>::type U;
            return std::unique_ptr<T>(new U[n]());
        }